

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QMimeMagicRuleMatcher>::emplace<QMimeMagicRuleMatcher_const&>
          (QMovableArrayOps<QMimeMagicRuleMatcher> *this,qsizetype i,QMimeMagicRuleMatcher *args)

{
  QMimeMagicRuleMatcher **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_90;
  QMimeMagicRuleMatcher tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
           super_QArrayDataPointer<QMimeMagicRuleMatcher>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
        super_QArrayDataPointer<QMimeMagicRuleMatcher>.size == i) {
      qVar5 = QArrayDataPointer<QMimeMagicRuleMatcher>::freeSpaceAtEnd
                        ((QArrayDataPointer<QMimeMagicRuleMatcher> *)this);
      if (qVar5 == 0) goto LAB_0044f09d;
      QMimeMagicRuleMatcher::QMimeMagicRuleMatcher
                ((this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
                 super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr +
                 (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
                 super_QArrayDataPointer<QMimeMagicRuleMatcher>.size,args);
LAB_0044f19a:
      pqVar2 = &(this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
                super_QArrayDataPointer<QMimeMagicRuleMatcher>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0044f159;
    }
LAB_0044f09d:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QMimeMagicRuleMatcher>::freeSpaceAtBegin
                        ((QArrayDataPointer<QMimeMagicRuleMatcher> *)this);
      if (qVar5 != 0) {
        QMimeMagicRuleMatcher::QMimeMagicRuleMatcher
                  ((this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
                   super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
                   super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0044f19a;
      }
    }
  }
  tmp.m_mimetype.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_mimetype.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_mimetype.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_list.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.m_list.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.m_list.d.ptr = (QMimeMagicRule *)&DAT_aaaaaaaaaaaaaaaa;
  QMimeMagicRuleMatcher::QMimeMagicRuleMatcher(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
          super_QArrayDataPointer<QMimeMagicRuleMatcher>.size != 0;
  QArrayDataPointer<QMimeMagicRuleMatcher>::detachAndGrow
            ((QArrayDataPointer<QMimeMagicRuleMatcher> *)this,(uint)(i == 0 && bVar6),1,
             (QMimeMagicRuleMatcher **)0x0,(QArrayDataPointer<QMimeMagicRuleMatcher> *)0x0);
  if (i == 0 && bVar6) {
    QMimeMagicRuleMatcher::QMimeMagicRuleMatcher
              ((this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
               super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
               super_QArrayDataPointer<QMimeMagicRuleMatcher>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QMimeMagicRuleMatcher>).
              super_QArrayDataPointer<QMimeMagicRuleMatcher>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_90,(QArrayDataPointer<QMimeMagicRuleMatcher> *)this,i,1);
    QMimeMagicRuleMatcher::QMimeMagicRuleMatcher(local_90.displaceFrom,&tmp);
    local_90.displaceFrom = local_90.displaceFrom + 1;
    (local_90.data)->size = (local_90.data)->size + local_90.nInserts;
  }
  QMimeMagicRuleMatcher::~QMimeMagicRuleMatcher(&tmp);
LAB_0044f159:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }